

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O0

void wabt::RenameAll(Module *module)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_142;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> local_141;
  basic_string_view<char,_std::char_traits<char>_> local_140 [15];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  filter;
  Module *module_local;
  
  filter._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)module;
  memcpy(local_140,&DAT_0043c570,0xf0);
  local_50 = local_140;
  local_48 = 0xf;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_142);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         *)local_40,__l,&local_141,&local_142);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_142);
  RenameToIdentifiers<wabt::Func>
            ((vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x88),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1b0),
             (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_40);
  RenameToIdentifiers<wabt::Global>
            ((vector<wabt::Global_*,_std::allocator<wabt::Global_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xa0),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1e8),
             (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0);
  RenameToIdentifiers<wabt::Table>
            ((vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x100),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x290),
             (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0);
  RenameToIdentifiers<wabt::Tag>
            ((vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x70),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x178),
             (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0);
  RenameToIdentifiers<wabt::Export>
            ((vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xd0),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x220),
             (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0);
  RenameToIdentifiers<wabt::TypeEntry>
            ((vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xe8),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 600),
             (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0);
  RenameToIdentifiers<wabt::Memory>
            ((vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x130),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x2c8),
             (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0);
  RenameToIdentifiers<wabt::DataSegment>
            ((vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x148),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x300),
             (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0);
  RenameToIdentifiers<wabt::ElemSegment>
            ((vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x118),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x338),
             (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0);
  RenameToContents((vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *)
                   (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x148),
                   (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x300))
  ;
  std::
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)local_40);
  return;
}

Assistant:

void RenameAll(Module& module) {
  // We also filter common C++ keywords/STL idents that make for huge
  // identifiers.
  // FIXME: this can obviously give bad results if the input is not C++..
  std::set<std::string_view> filter = {
      {"const"},    {"std"},   {"allocator"}, {"char"},  {"basic"},
      {"traits"},   {"wchar"}, {"t"},         {"void"},  {"int"},
      {"unsigned"}, {"2"},     {"cxxabiv1"},  {"short"}, {"4096ul"},
  };
  RenameToIdentifiers(module.funcs, module.func_bindings, &filter);
  // Also do this for some other kinds of names, but without the keyword
  // substitution.
  RenameToIdentifiers(module.globals, module.global_bindings, nullptr);
  RenameToIdentifiers(module.tables, module.table_bindings, nullptr);
  RenameToIdentifiers(module.tags, module.tag_bindings, nullptr);
  RenameToIdentifiers(module.exports, module.export_bindings, nullptr);
  RenameToIdentifiers(module.types, module.type_bindings, nullptr);
  RenameToIdentifiers(module.memories, module.memory_bindings, nullptr);
  RenameToIdentifiers(module.data_segments, module.data_segment_bindings,
                      nullptr);
  RenameToIdentifiers(module.elem_segments, module.elem_segment_bindings,
                      nullptr);
  // Special purpose naming for data segments.
  RenameToContents(module.data_segments, module.data_segment_bindings);
}